

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Cluster * mkvparser::Cluster::Create(Segment *pSegment,long idx,longlong off)

{
  Cluster *pCVar1;
  long lVar2;
  
  if (off < 0 || pSegment == (Segment *)0x0) {
    return (Cluster *)0x0;
  }
  lVar2 = pSegment->m_start;
  pCVar1 = (Cluster *)operator_new(0x48,(nothrow_t *)&std::nothrow);
  if (pCVar1 == (Cluster *)0x0) {
    pCVar1 = (Cluster *)0x0;
  }
  else {
    lVar2 = lVar2 + off;
    pCVar1->m_pSegment = pSegment;
    pCVar1->m_element_start = lVar2;
    pCVar1->m_index = idx;
    pCVar1->m_pos = lVar2;
    *(undefined4 *)&pCVar1->m_element_size = 0xffffffff;
    *(undefined4 *)((long)&pCVar1->m_element_size + 4) = 0xffffffff;
    *(undefined4 *)&pCVar1->m_timecode = 0xffffffff;
    *(undefined4 *)((long)&pCVar1->m_timecode + 4) = 0xffffffff;
    pCVar1->m_entries = (BlockEntry **)0x0;
    pCVar1->m_entries_size = 0;
    pCVar1->m_entries_count = -1;
  }
  return pCVar1;
}

Assistant:

Cluster* Cluster::Create(Segment* pSegment, long idx, long long off) {
  if (!pSegment || off < 0)
    return NULL;

  const long long element_start = pSegment->m_start + off;

  Cluster* const pCluster =
      new (std::nothrow) Cluster(pSegment, idx, element_start);

  return pCluster;
}